

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O0

void __thiscall Thread::Thread(Thread *this,Json *json)

{
  string_view replacement;
  string_view replacement_00;
  string_view find;
  string_view find_00;
  const_reference pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_RDI;
  string *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_01;
  string *this_02;
  basic_string_view<char,_std::char_traits<char>_> *this_03;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffe58;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_04;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  string *str;
  string *this_05;
  string *this_06;
  string local_140 [32];
  string local_120 [56];
  string *in_stack_ffffffffffffff18;
  string local_e0 [32];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0 [4];
  string local_80 [32];
  string local_60;
  string local_30 [48];
  
  this_06 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  this_00 = in_RDI + 0x20;
  std::__cxx11::string::string(this_00);
  this_01 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)(in_RDI + 0x40);
  std::__cxx11::string::string((string *)this_01);
  std::__cxx11::string::string(in_RDI + 0x60);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(this_01,(char *)this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffe58);
  this_05 = local_30;
  std::__cxx11::string::operator=(this_06,this_05);
  std::__cxx11::string::~string(this_05);
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>(this_01,(char *)this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffe58);
  replaceHtmlSymbols(in_stack_ffffffffffffff18);
  this_02 = this_06 + 0x20;
  str = &local_60;
  std::__cxx11::string::operator=(this_02,(string *)str);
  std::__cxx11::string::~string((string *)str);
  std::__cxx11::string::~string(local_80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
  find._M_str = (char *)this_06;
  find._M_len = (size_t)pvVar1;
  replacement._M_str = (char *)this_05;
  replacement._M_len = (size_t)this_02;
  ::str::replace_all(str,find,replacement);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>(this_01,(char *)this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffe58);
  replaceHtmlSymbols(in_stack_ffffffffffffff18);
  this_03 = (basic_string_view<char,_std::char_traits<char>_> *)(this_06 + 0x40);
  this_04 = local_c0;
  std::__cxx11::string::operator=((string *)this_03,(string *)this_04);
  std::__cxx11::string::~string((string *)this_04);
  std::__cxx11::string::~string(local_e0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_03,(char *)this_04);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_03,(char *)this_04);
  find_00._M_str = (char *)this_06;
  find_00._M_len = (size_t)pvVar1;
  replacement_00._M_str = (char *)this_05;
  replacement_00._M_len = (size_t)this_02;
  ::str::replace_all(str,find_00,replacement_00);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>(this_01,(char *)this_00);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::get<std::__cxx11::string,std::__cxx11::string>(this_04);
  std::operator+((char *)this_04,__rhs);
  std::__cxx11::string::operator=(this_06 + 0x60,local_120);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  return;
}

Assistant:

Thread(const Json& json) {
			id = json["id"].get<std::string>();

			selftext = replaceHtmlSymbols(json["selftext"].get<std::string>());
			str::replace_all(selftext, "\\_", "_");

			title = replaceHtmlSymbols(json["title"].get<std::string>());
			str::replace_all(title, "\\_", "_");

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();
		}